

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O2

void __thiscall
ut::test_case_impl<agge::tests::LayoutTests>::test_case_impl
          (test_case_impl<agge::tests::LayoutTests> *this,method_t method,string *name,
          shared_ptr<ut::setup_impl<agge::tests::LayoutTests>,_unsigned_int> *setup)

{
  shared_ptr<ut::setup_impl<agge::tests::LayoutTests>,_unsigned_int> *in_R8;
  
  (this->super_test_case).super_destructible._vptr_destructible =
       (_func_int **)&PTR__test_case_impl_001c64d8;
  this->_method = method;
  *(string **)&this->field_0x10 = name;
  exportable::immutable_basic_string<char>::construct
            (&this->_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)setup
            );
  shared_ptr<ut::setup_impl<agge::tests::LayoutTests>,_unsigned_int>::shared_ptr
            (&this->_setup,in_R8);
  return;
}

Assistant:

inline test_case_impl<Fixture>::test_case_impl(method_t method, const std::string &name,
			shared_ptr< setup_impl<Fixture> > setup)
		: _method(method), _name(name), _setup(setup)
	{	}